

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::HelperInvocationDerivateCase::HelperInvocationDerivateCase
          (HelperInvocationDerivateCase *this,Context *context,char *name,char *description,
          PrimitiveType primType,int numSamples,char *derivateFunc,bool checkAbsoluteValue)

{
  allocator<char> local_32;
  byte local_31;
  int local_30;
  PrimitiveType PStack_2c;
  bool checkAbsoluteValue_local;
  int numSamples_local;
  PrimitiveType primType_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  HelperInvocationDerivateCase *this_local;
  
  local_31 = checkAbsoluteValue;
  local_30 = numSamples;
  PStack_2c = primType;
  _numSamples_local = description;
  description_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__HelperInvocationDerivateCase_011cff48;
  this->m_primitiveType = PStack_2c;
  this->m_numSamples = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_derivateFunc,derivateFunc,&local_32);
  std::allocator<char>::~allocator(&local_32);
  this->m_checkAbsoluteValue = (bool)(local_31 & 1);
  this->m_numIters = 0x10;
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::MovePtr
            (&this->m_program);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
  ::MovePtr(&this->m_fbo);
  this->m_iterNdx = 0;
  return;
}

Assistant:

HelperInvocationDerivateCase::HelperInvocationDerivateCase (Context& context, const char* name, const char* description, PrimitiveType primType, int numSamples, const char* derivateFunc, bool checkAbsoluteValue)
	: TestCase					(context, name, description)
	, m_primitiveType			(primType)
	, m_numSamples				(numSamples)
	, m_derivateFunc			(derivateFunc)
	, m_checkAbsoluteValue		(checkAbsoluteValue)
	, m_numIters				(16)
	, m_iterNdx					(0)
{
}